

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

pair<double,_double> __thiscall
imrt::EvaluationFunction::get_value_cost
          (EvaluationFunction *this,int angle,int b,vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  reference ppVar4;
  Matrix *this_00;
  reference pvVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *in_RCX;
  int in_EDX;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  pair<double,_double> pVar7;
  double c;
  Matrix *Dep;
  int k;
  int o;
  pair<const_double,_std::pair<int,_int>_> voxel;
  iterator __end1;
  iterator __begin1;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  *__range1;
  double value;
  double cost;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  Volume *in_stack_fffffffffffffee0;
  int iStack_a0;
  int iStack_9c;
  _Self local_90;
  _Self local_88;
  undefined1 *local_80;
  double local_78;
  double local_70;
  pair<int,_int> local_68;
  undefined1 local_60 [48];
  vector<double,_std::allocator<double>_> *local_30;
  vector<double,_std::allocator<double>_> *local_28;
  int local_20;
  double local_10;
  double local_8;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_EDX;
  local_68 = std::make_pair<int&,int&>
                       ((int *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        (int *)0x16cfda);
  std::
  unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
  ::at((unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
        *)in_stack_fffffffffffffee0,
       (key_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::multimap((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)in_stack_fffffffffffffee0,
             (multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_70 = 0.0;
  local_78 = 0.0;
  local_80 = local_60;
  local_88._M_node =
       (_Base_ptr)
       std::
       multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
       ::begin((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_90._M_node =
       (_Base_ptr)
       std::
       multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
       ::end((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar3 = std::operator!=(&local_88,&local_90), bVar3) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_> *)
                        0x16d081);
    iStack_a0 = (ppVar4->second).first;
    iStack_9c = (ppVar4->second).second;
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::operator[]
              (*(vector<imrt::Volume,_std::allocator<imrt::Volume>_> **)(in_RDI + 0x40),
               (long)iStack_a0);
    this_00 = Volume::getDepositionMatrix(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)iStack_a0);
    if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) {
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)iStack_a0);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)iStack_9c);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)iStack_a0);
      if (dVar1 < *pvVar5) {
        dVar1 = maths::Matrix::operator()(this_00,iStack_9c,local_20);
        local_78 = dVar1 + local_78;
      }
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)iStack_a0);
      dVar1 = *pvVar5;
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)iStack_a0);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)iStack_9c);
      if ((dVar1 - *pvVar5 != 0.0) || (NAN(dVar1 - *pvVar5))) {
        dVar2 = maths::Matrix::operator()(this_00,iStack_9c,local_20);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)iStack_a0);
        dVar1 = *pvVar5;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x10),(long)iStack_a0);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)iStack_9c);
        dVar2 = dVar2 / (dVar1 - *pvVar5);
        if (local_70 < dVar2) {
          local_70 = dVar2;
        }
      }
      else {
        local_70 = 1e+20;
      }
    }
    std::_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffee0);
  }
  pVar7 = std::make_pair<double&,double&>
                    ((double *)in_stack_fffffffffffffee0,
                     (double *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_8 = pVar7.second;
  local_10 = pVar7.first;
  std::
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::~multimap((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
               *)0x16d307);
  pVar7.second = local_8;
  pVar7.first = local_10;
  return pVar7;
}

Assistant:

pair<double,double> EvaluationFunction::get_value_cost(int angle, int b, vector<double>& Zmin, vector<double>& Zmax){
	multimap<double, pair<int,int> > voxels = beamlet2voxel_list.at(make_pair(angle,b));
	double cost=0.0, value=0.0;
	 for(auto voxel:voxels){
		 int o=voxel.second.first, k=voxel.second.second;
		 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		 if(Zmin[o]==0.0){//organ
			 if(Zmax[o]-Z[o][k] == 0) cost=1e20;
			 else{
				 double c=Dep(k,b)/(Zmax[o]-Z[o][k]);
			 	 if(c>cost) cost=c;
			 }
		 }else
			 if(Z[o][k] < Zmin[o]) value += Dep(k,b);
	 }

	 return make_pair(value,cost);
}